

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O0

void anon_unknown.dwarf_11e01b::writeFile(Header *h,string *filename)

{
  int iVar1;
  undefined4 *puVar2;
  long lVar3;
  char *pcVar4;
  Header *in_RDI;
  uint value;
  FrameBuffer buf;
  OutputFile file;
  ChannelList chans;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  Slice local_e0 [60];
  char local_a4 [52];
  undefined1 local_70 [48];
  char local_40 [56];
  Header *local_8;
  
  local_8 = in_RDI;
  puVar2 = (undefined4 *)Imf_3_4::Header::dataWindow();
  *puVar2 = 0;
  lVar3 = Imf_3_4::Header::dataWindow();
  *(undefined4 *)(lVar3 + 4) = 0;
  lVar3 = Imf_3_4::Header::dataWindow();
  *(undefined4 *)(lVar3 + 8) = 0;
  lVar3 = Imf_3_4::Header::dataWindow();
  *(undefined4 *)(lVar3 + 0xc) = 0;
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::displayWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  Imf_3_4::ChannelList::ChannelList((ChannelList *)0x1a591f);
  Imf_3_4::Channel::Channel((Channel *)(local_70 + 0x20),UINT,1,1,false);
  Imf_3_4::ChannelList::insert(local_40,(Channel *)0x224ad8);
  Imf_3_4::Header::channels();
  Imf_3_4::ChannelList::operator=
            ((ChannelList *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (ChannelList *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)local_70,pcVar4,local_8,iVar1);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1a59d5);
  local_a4[0] = '\x01';
  local_a4[1] = '\0';
  local_a4[2] = '\0';
  local_a4[3] = '\0';
  Imf_3_4::Slice::Slice(local_e0,UINT,local_a4,1,0,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert(local_a4 + 4,(Slice *)0x224ad8);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)local_70);
  Imf_3_4::OutputFile::writePixels((int)local_70);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1a5a71);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)local_70);
  Imf_3_4::ChannelList::~ChannelList((ChannelList *)0x1a5a8b);
  return;
}

Assistant:

void
writeFile (Header& h, const string& filename)
{
    h.dataWindow ().min.x = 0;
    h.dataWindow ().min.y = 0;
    h.dataWindow ().max.x = 0;
    h.dataWindow ().max.y = 0;
    h.displayWindow ()    = h.dataWindow ();
    ChannelList chans;
    chans.insert ("id", Channel (UINT));
    h.channels () = chans;
    OutputFile   file (filename.c_str (), h);
    FrameBuffer  buf;
    unsigned int value = 1;
    buf.insert ("id", Slice (UINT, (char*) &value, 1, 0));
    file.setFrameBuffer (buf);
    file.writePixels (1);
}